

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void fmt::v7::detail::format_error_code(buffer<char> *out,int error_code,string_view message)

{
  int value;
  type tVar1;
  uint32_t n;
  char (*in_R8) [3];
  int local_2c;
  char *local_28;
  ulong local_20;
  
  local_28 = message.data_;
  local_2c = error_code;
  local_20 = message.size_;
  buffer<char>::try_resize(out,0);
  n = -error_code;
  if (0 < error_code) {
    n = error_code;
  }
  value = count_digits(n);
  tVar1 = to_unsigned<int>(value);
  if (message.size_ <= 0x1ec - ((ulong)((uint)error_code >> 0x1f) + (ulong)tVar1)) {
    format_to<fmt::v7::detail::buffer_appender<char>,_char[5],_fmt::v7::basic_string_view<char>_&,_const_char_(&)[3],_0>
              ((v7 *)out,(buffer_appender<char>)0x11ee94,(char (*) [5])&local_28,
               (basic_string_view<char> *)": ",in_R8);
  }
  format_to<fmt::v7::detail::buffer_appender<char>,_char[5],_const_char_(&)[7],_int_&,_0>
            ((v7 *)out,(buffer_appender<char>)0x11ee94,(char (*) [5])"error ",
             (char (*) [7])&local_2c,(int *)in_R8);
  if (out->size_ < 0x1f5) {
    return;
  }
  __assert_fail("out.size() <= inline_buffer_size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/foundation/3rdparty/fmt/include/fmt/format-inl.h"
                ,0xa3,
                "void fmt::detail::format_error_code(detail::buffer<char> &, int, string_view)");
}

Assistant:

FMT_FUNC void format_error_code(detail::buffer<char>& out, int error_code,
                                string_view message) FMT_NOEXCEPT {
  // Report error code making sure that the output fits into
  // inline_buffer_size to avoid dynamic memory allocation and potential
  // bad_alloc.
  out.try_resize(0);
  static const char SEP[] = ": ";
  static const char ERROR_STR[] = "error ";
  // Subtract 2 to account for terminating null characters in SEP and ERROR_STR.
  size_t error_code_size = sizeof(SEP) + sizeof(ERROR_STR) - 2;
  auto abs_value = static_cast<uint32_or_64_or_128_t<int>>(error_code);
  if (detail::is_negative(error_code)) {
    abs_value = 0 - abs_value;
    ++error_code_size;
  }
  error_code_size += detail::to_unsigned(detail::count_digits(abs_value));
  auto it = buffer_appender<char>(out);
  if (message.size() <= inline_buffer_size - error_code_size)
    format_to(it, "{}{}", message, SEP);
  format_to(it, "{}{}", ERROR_STR, error_code);
  assert(out.size() <= inline_buffer_size);
}